

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O1

void __thiscall sparse_tree::sparse_tree(sparse_tree *this,string *structure,int n)

{
  pointer pNVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  size_type __new_size;
  size_type __new_size_00;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  string *local_58;
  string local_50;
  
  memset(this,0,0xa8);
  (this->structure)._M_dataplus._M_p = (pointer)&(this->structure).field_2;
  (this->structure)._M_string_length = 0;
  (this->structure).field_2._M_local_buf[0] = '\0';
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = (uint16_t)n;
  local_58 = &this->structure;
  std::__cxx11::string::_M_assign((string *)&this->structure);
  __new_size_00 = (size_type)(n + 1);
  local_98 = ZEXT816(0xfffffffeffffffff) << 0x40;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  std::vector<Node,_std::allocator<Node>_>::resize(&this->tree,__new_size_00,(value_type *)local_98)
  ;
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._8_8_,local_68._8_8_ - local_78._8_8_);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,local_78._0_8_ - local_88._0_8_);
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_98 = ZEXT816(0xfffffffe00000000) << 0x40;
  pNVar1 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1->parent = (Node *)0x0;
  pNVar1->index = 0;
  pNVar1->pair = -2;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&pNVar1->bases);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&pNVar1->children,local_78 + 8);
  if ((pointer)local_78._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._8_8_,local_68._8_8_ - local_78._8_8_);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,local_78._0_8_ - local_88._0_8_);
  }
  __new_size = (size_type)((n + 1) * 2);
  local_98._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->FAI,__new_size,(value_type_conflict *)local_98);
  local_98._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->level,__new_size_00,(value_type_conflict *)local_98);
  std::vector<int,_std::allocator<int>_>::resize(&this->up,__new_size_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->logn,__new_size);
  pcVar2 = (structure->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + structure->_M_string_length);
  create_tree(this,n,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  preprocess(this);
  this->ptr = 0;
  dfs(this,0,-1,0);
  makeArr(this);
  piVar3 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  piVar3 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = (undefined1  [16])0x0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_88._8_8_;
  local_88 = auVar5 << 0x40;
  local_98._0_8_ = operator_new(0x38);
  local_88._0_8_ = (undefined4 *)(local_98._0_8_ + 0x38);
  *(undefined4 *)(local_98._0_8_ + 0x20) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x24) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x28) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x2c) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x10) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x14) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x18) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0x1c) = 0xffffffff;
  *(undefined4 *)local_98._0_8_ = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 4) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 8) = 0xffffffff;
  *(undefined4 *)(local_98._0_8_ + 0xc) = 0xffffffff;
  *(undefined8 *)(local_98._0_8_ + 0x30) = 0xffffffffffffffff;
  local_98._8_8_ = (undefined4 *)(local_98._0_8_ + 0x38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->sparse_table,(long)piVar4 - (long)piVar3 >> 2,(value_type *)local_98);
  if ((Node *)local_98._0_8_ != (Node *)0x0) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
  }
  buildSparseTable(this,(int)((ulong)((long)(this->euler).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                     (long)(this->euler).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

sparse_tree::sparse_tree(std::string structure,int n){
    this->n = n;
    this->structure = structure;
    tree.resize(n+1,Node());
    tree[0] = Node(0);
    FAI.resize(2*(n+1),-1);
    level.resize((n+1),-1);
    up.resize(n+1);
    logn.resize(2*(n+1));
    create_tree(n,structure);
    preprocess();
    ptr = 0;

    int cur = 1;
    dfs(0,-1,0);
    // depthArr.resize(euler.size());
    makeArr();
    level.clear();
    sparse_table.resize(euler.size(),std::vector<int>(maxSize,-1));
    buildSparseTable(euler.size());
}